

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O2

void __thiscall
gmlc::networking::AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>::
AsioSocket(AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_> *this,
          io_context *io_context)

{
  (this->super_Socket).super_enable_shared_from_this<gmlc::networking::Socket>._M_weak_this.
  super___weak_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_Socket).super_enable_shared_from_this<gmlc::networking::Socket>._M_weak_this.
  super___weak_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Socket).handshake_server_ = false;
  (this->super_Socket)._vptr_Socket = (_func_int **)&PTR_write_some_0046f760;
  asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::basic_socket<asio::io_context>
            (&(this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>,io_context,0)
  ;
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::basic_resolver<asio::io_context>
            (&this->resolver_,io_context,0);
  return;
}

Assistant:

AsioSocket(asio::io_context& io_context) :
        socket_(io_context), resolver_(io_context)
    {
    }